

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sip_decomposer.cc
# Opt level: O2

HomomorphismResult *
gss::solve_sip_by_decomposition
          (HomomorphismResult *__return_storage_ptr__,InputGraph *pattern,InputGraph *target,
          HomomorphismParams *params)

{
  bool bVar1;
  bool e;
  type_conflict tVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  _Base_ptr p_Var7;
  limb_type lVar8;
  int i;
  size_type __n;
  int j;
  size_type __n_00;
  number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  local_211;
  number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
  *local_210;
  InputGraph reduced_pattern;
  set<int,_std::less<int>,_std::allocator<int>_> t_avail;
  VertexToVertexMapping sub_mapping;
  vector<int,_std::allocator<int>_> reduced_to_original;
  set<int,_std::less<int>,_std::allocator<int>_> isolated_pattern_vertices;
  vector<int,_std::allocator<int>_> original_to_reduced;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void>
  local_130;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  denominator;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  local_f8;
  loooong solution_multiplier;
  data_type local_b8;
  uint local_a8;
  undefined2 local_a4;
  undefined1 local_a2;
  loooong unmapped_target_vertices;
  data_type local_78;
  undefined4 local_68;
  undefined2 local_64;
  undefined1 local_62;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  cf;
  
  isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header;
  isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210 = (number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
               *)target;
  isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((((params->induced == false) &&
       ((params->pattern_less_constraints).
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next ==
        (_List_node_base *)&params->pattern_less_constraints)) &&
      ((params->target_occur_less_constraints).
       super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next ==
       (_List_node_base *)&params->target_occur_less_constraints)) &&
     ((params->lackey)._M_t.
      super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t.
      super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
      super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0)) {
    bVar1 = InputGraph::has_vertex_labels(pattern);
    if ((!bVar1) &&
       ((params->count_solutions != true ||
        ((params->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0)))) {
      bVar1 = InputGraph::directed(pattern);
      if (!bVar1) {
        iVar3 = 0;
        while( true ) {
          t_avail._M_t._M_impl._0_4_ = iVar3;
          iVar4 = InputGraph::size(pattern);
          if (iVar4 <= iVar3) break;
          iVar3 = InputGraph::degree(pattern,t_avail._M_t._M_impl._0_4_);
          if (iVar3 == 0) {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_emplace_unique<int&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &isolated_pattern_vertices,(int *)&t_avail);
          }
          iVar3 = t_avail._M_t._M_impl._0_4_ + 1;
        }
      }
    }
  }
  if (isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    solve_homomorphism_problem(__return_storage_ptr__,pattern,(InputGraph *)local_210,params);
  }
  else {
    iVar3 = InputGraph::size(pattern);
    iVar3 = iVar3 - (int)isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count;
    bVar1 = InputGraph::has_vertex_labels(pattern);
    e = InputGraph::has_edge_labels(pattern);
    InputGraph::InputGraph(&reduced_pattern,iVar3,bVar1,e);
    iVar3 = 0;
    original_to_reduced.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    reduced_to_original.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    original_to_reduced.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    original_to_reduced.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    reduced_to_original.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    reduced_to_original.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      t_avail._M_t._M_impl._0_4_ = iVar3;
      iVar4 = InputGraph::size(pattern);
      if (iVar4 <= iVar3) break;
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&isolated_pattern_vertices,(key_type *)&t_avail);
      if (sVar5 == 0) {
        sub_mapping._M_t._M_impl._0_4_ =
             (int)((ulong)((long)reduced_to_original.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)reduced_to_original.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&original_to_reduced,(int *)&sub_mapping);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&reduced_to_original,(value_type_conflict1 *)&t_avail);
      }
      else {
        sub_mapping._M_t._M_impl._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&original_to_reduced,(int *)&sub_mapping);
      }
      iVar3 = t_avail._M_t._M_impl._0_4_ + 1;
    }
    __n = 0;
    while( true ) {
      iVar3 = InputGraph::size(pattern);
      if ((long)iVar3 <= (long)__n) break;
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(&original_to_reduced,__n);
      iVar3 = *pvVar6;
      if (iVar3 != -1) {
        __n_00 = 0;
        while( true ) {
          iVar4 = InputGraph::size(pattern);
          if ((long)iVar4 <= (long)__n_00) break;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(&original_to_reduced,__n_00);
          iVar4 = *pvVar6;
          if (iVar4 != -1) {
            bVar1 = InputGraph::adjacent(pattern,(int)__n,(int)__n_00);
            if (bVar1) {
              InputGraph::add_directed_edge
                        (&reduced_pattern,iVar3,iVar4,(string_view)(ZEXT816(0x1614cd) << 0x40));
            }
          }
          __n_00 = __n_00 + 1;
        }
      }
      __n = __n + 1;
    }
    solve_homomorphism_problem
              (__return_storage_ptr__,&reduced_pattern,(InputGraph *)local_210,params);
    std::__cxx11::to_string
              ((string *)&sub_mapping,
               isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_avail,
                   "isolated_pattern_vertices = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sub_mapping
                  );
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->extra_stats,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t_avail);
    std::__cxx11::string::~string((string *)&t_avail);
    std::__cxx11::string::~string((string *)&sub_mapping);
    if ((__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &t_avail._M_t._M_impl.super__Rb_tree_header._M_header;
      iVar3 = 0;
      t_avail._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           t_avail._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      t_avail._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        sub_mapping._M_t._M_impl._0_4_ = iVar3;
        iVar4 = InputGraph::size((InputGraph *)local_210);
        if (iVar4 <= iVar3) break;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_emplace_unique<int&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &t_avail,(int *)&sub_mapping);
        iVar3 = sub_mapping._M_t._M_impl._0_4_ + 1;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&sub_mapping._M_t,
                 (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)__return_storage_ptr__);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)__return_storage_ptr__);
      for (p_Var7 = sub_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &sub_mapping._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                  (&t_avail._M_t,(key_type *)&p_Var7[1].field_0x4);
        pvVar6 = std::vector<int,_std::allocator<int>_>::at
                           (&reduced_to_original,(long)(int)p_Var7[1]._M_color);
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int&,int&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,pvVar6,(int *)&p_Var7[1].field_0x4);
      }
      for (p_Var7 = isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header
          ; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int_const&,int_const&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,(int *)(p_Var7 + 1),
                   (int *)(t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&t_avail,
                         (const_iterator)
                         t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&sub_mapping._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&t_avail._M_t);
    }
    if (params->count_solutions == true) {
      tVar2 = boost::multiprecision::backends::
              eval_gt<0u,0u,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                        (&(__return_storage_ptr__->solution_count).m_backend,0);
      if (tVar2) {
        iVar3 = InputGraph::size((InputGraph *)local_210);
        iVar4 = InputGraph::size(&reduced_pattern);
        lVar8 = (limb_type)(iVar3 - iVar4);
        unmapped_target_vertices.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.la[0] = -lVar8;
        if (0 < (long)lVar8) {
          unmapped_target_vertices.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_data._0_8_ = lVar8;
        }
        unmapped_target_vertices.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs = 1;
        unmapped_target_vertices.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_sign = (bool)((byte)(iVar3 - iVar4 >> 0x1f) >> 7);
        unmapped_target_vertices.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal = true;
        unmapped_target_vertices.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias = false;
        local_210 = (number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                     *)&__return_storage_ptr__->solution_count;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::cpp_int_base(&local_f8,
                       (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&unmapped_target_vertices);
        local_b8.la[0] = isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count;
        solution_multiplier.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs = 1;
        local_a4 = 0x100;
        local_a2 = 0;
        t_avail._M_t._M_impl._0_8_ = 1;
        t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             CONCAT17(t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_,
                      0x10000000001);
        solution_multiplier.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.la[0] = 1;
        solution_multiplier.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_sign = false;
        solution_multiplier.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal = true;
        solution_multiplier.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias = false;
        local_a8 = solution_multiplier.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_limbs;
        while( true ) {
          tVar2 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&t_avail,
                             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_b8.ld);
          if (!tVar2) break;
          denominator.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_data.la[0] = (limb_type)&local_f8;
          denominator.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_data.ld.data = (limb_pointer)&local_b8;
          denominator.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ._16_8_ = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&t_avail;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::plus,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                      *)&sub_mapping,
                     (expression<boost::multiprecision::detail::plus,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&denominator,(type *)0x0);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&denominator,
                         (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                          *)&t_avail);
          local_130.arg1 = &local_211;
          local_130.arg2 = &solution_multiplier;
          local_130.arg3 = (type)&denominator;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void>
                    ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                      *)&cf,&local_130,(type *)0x0);
          boost::multiprecision::backends::
          eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    (&solution_multiplier.m_backend,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&cf);
          boost::multiprecision::backends::
          eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&denominator,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&cf);
          boost::multiprecision::backends::
          eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&sub_mapping,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&denominator);
          boost::multiprecision::backends::
          eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    (&solution_multiplier.m_backend,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&sub_mapping);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           *)&cf);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           *)&denominator);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           *)&sub_mapping);
          boost::multiprecision::backends::
          eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&t_avail);
        }
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&t_avail);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&local_b8.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base(&local_f8);
        local_78.la[0] = isolated_pattern_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count;
        sub_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 1;
        t_avail._M_t._M_impl._0_8_ = 2;
        local_64 = 0x100;
        sub_mapping._M_t._M_impl._0_8_ = 1;
        sub_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_2_ = 0x100;
        local_62 = 0;
        sub_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._6_1_ = 0;
        t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             CONCAT17(t_avail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_,
                      0x10000000001);
        local_68 = sub_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_;
        while( true ) {
          tVar2 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&t_avail,
                             (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                              *)&local_78.ld);
          if (!tVar2) break;
          boost::multiprecision::backends::
          eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&sub_mapping,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&t_avail);
          boost::multiprecision::backends::
          eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&t_avail);
        }
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&t_avail);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&local_78.ld);
        t_avail._M_t._M_impl._0_8_ = &solution_multiplier;
        t_avail._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &sub_mapping;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=(local_210,
                     (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&t_avail);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&sub_mapping);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&solution_multiplier);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::~cpp_int_base((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                         *)&unmapped_target_vertices);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&reduced_to_original.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&original_to_reduced.super__Vector_base<int,_std::allocator<int>_>);
    InputGraph::~InputGraph(&reduced_pattern);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&isolated_pattern_vertices._M_t);
  return __return_storage_ptr__;
}

Assistant:

auto gss::solve_sip_by_decomposition(const InputGraph & pattern, const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    set<int> isolated_pattern_vertices;
    find_removable_isolated_pattern_vertices(pattern, params, isolated_pattern_vertices);

    if (! isolated_pattern_vertices.empty()) {
        InputGraph reduced_pattern(pattern.size() - isolated_pattern_vertices.size(), pattern.has_vertex_labels(),
            pattern.has_edge_labels());

        vector<int> original_to_reduced, reduced_to_original;

        for (int i = 0; i < pattern.size(); ++i) {
            if (isolated_pattern_vertices.count(i))
                original_to_reduced.push_back(-1);
            else {
                original_to_reduced.push_back(reduced_to_original.size());
                reduced_to_original.push_back(i);
            }
        }

        for (int i = 0; i < pattern.size(); ++i) {
            auto r_i = original_to_reduced.at(i);
            if (r_i == -1)
                continue;

            for (int j = 0; j < pattern.size(); ++j) {
                auto r_j = original_to_reduced.at(j);
                if (r_j == -1)
                    continue;

                if (pattern.adjacent(i, j))
                    reduced_pattern.add_directed_edge(r_i, r_j, "");
            }
        }
        auto result = solve_homomorphism_problem(reduced_pattern, target, params);

        result.extra_stats.emplace_back("isolated_pattern_vertices = " + to_string(isolated_pattern_vertices.size()));

        // fix up the result to be in the non-decomposed form
        if (! result.mapping.empty()) {
            // need to re-add isolated vertices, arbitrarily. what's available?
            set<int> t_avail;
            for (int i = 0; i < target.size(); ++i)
                t_avail.emplace(i);

            // convert back to original indices, and remove used vertices
            auto sub_mapping = result.mapping;
            result.mapping.clear();
            for (auto & [p, t] : sub_mapping) {
                t_avail.erase(t);
                result.mapping.emplace(reduced_to_original.at(p), t);
            }

            // add in isolated vertices
            for (auto & p : isolated_pattern_vertices) {
                result.mapping.emplace(p, *t_avail.begin());
                t_avail.erase(t_avail.begin());
            }
        }

        // fix up the solution count
        if (params.count_solutions && result.solution_count > 0) {
            loooong unmapped_target_vertices = target.size() - reduced_pattern.size();
            loooong solution_multiplier = n_choose_k<loooong>(unmapped_target_vertices, isolated_pattern_vertices.size());
            loooong isolated_symmetry_multiplier = factorial<loooong>(isolated_pattern_vertices.size());
            result.solution_count *= solution_multiplier * isolated_symmetry_multiplier;
        }

        return result;
    }
    else
        return solve_homomorphism_problem(pattern, target, params);
}